

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectExpression.cpp
# Opt level: O0

void __thiscall
ObjectExpression::putExpression
          (ObjectExpression *this,Identifier *ident,Scope scope,ptr<Expression> *expression,
          bool constant)

{
  mapped_type *this_00;
  Identifier local_80;
  undefined1 local_60 [8];
  Symbol symbol;
  bool constant_local;
  ptr<Expression> *expression_local;
  Scope scope_local;
  Identifier *ident_local;
  ObjectExpression *this_local;
  
  symbol.scope._3_1_ = constant;
  std::__cxx11::string::string((string *)&local_80,(string *)ident);
  Symbol::Symbol((Symbol *)local_60,&local_80,(bool)(symbol.scope._3_1_ & 1),scope);
  std::__cxx11::string::~string((string *)&local_80);
  this_00 = std::
            unordered_map<Symbol,_std::shared_ptr<Expression>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Expression>_>_>_>
            ::operator[](&this->expressionMap,(key_type *)local_60);
  std::shared_ptr<Expression>::operator=(this_00,expression);
  Symbol::~Symbol((Symbol *)local_60);
  return;
}

Assistant:

void ObjectExpression::putExpression(const Identifier &ident, Scope scope, ptr<Expression> expression, bool constant) {
    Symbol symbol(ident, constant, scope);
    expressionMap[symbol] = std::move(expression);
}